

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,bool local,ChVector<double> *p1,ChVector<double> *dirZ1,
          ChVector<double> *p2,ChVector<double> *dirX2,ChVector<double> *dirY2,bool auto_distance,
          double distance)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined7 in_register_00000009;
  ChBodyFrame *pCVar4;
  ChBodyFrame *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVector<double> local_168;
  ChVector<double> *local_148;
  uint local_13c;
  ChVector<double> local_138;
  ChVector<double> local_118;
  ChVector<double> local_f8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  ChVector<double> local_88;
  ChVector<double> local_68;
  double local_48;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = &peVar1->super_ChBodyFrame;
  local_13c = (uint)auto_distance;
  if (peVar1 == (element_type *)0x0) {
    pCVar5 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar5;
  peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar4;
  local_48 = distance;
  iVar2 = (*(pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar2),
             (ChVariables *)CONCAT44(extraout_var_00,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar2),
             (ChVariables *)CONCAT44(extraout_var_02,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar2),
             (ChVariables *)CONCAT44(extraout_var_04,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar2),
             (ChVariables *)CONCAT44(extraout_var_06,iVar3));
  local_f8.m_data[2] = 0.0;
  local_118.m_data[2] = 0.0;
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  local_118.m_data[0] = 0.0;
  local_118.m_data[1] = 0.0;
  if ((int)CONCAT71(in_register_00000009,local) == 0) {
    if (&local_f8 != p1) {
      local_f8.m_data[0] = p1->m_data[0];
      local_f8.m_data[1] = p1->m_data[1];
      local_f8.m_data[2] = p1->m_data[2];
    }
    if (&local_118 != p2) {
      local_118.m_data[0] = p2->m_data[0];
      local_118.m_data[1] = p2->m_data[1];
      local_118.m_data[2] = p2->m_data[2];
    }
    Vnorm<double>(&local_68,dirZ1);
    local_168.m_data[0] = local_68.m_data[0];
    local_168.m_data[1] = local_68.m_data[1];
    local_168.m_data[2] = local_68.m_data[2];
    Vnorm<double>(&local_88,dirX2);
    local_68.m_data[0] = local_88.m_data[0];
    local_68.m_data[1] = local_88.m_data[1];
    local_68.m_data[2] = local_88.m_data[2];
    Vnorm<double>(&local_138,dirY2);
    local_88.m_data[0] = local_138.m_data[0];
    local_88.m_data[1] = local_138.m_data[1];
    local_88.m_data[2] = local_138.m_data[2];
    ChFrame<double>::TransformPointParentToLocal
              (&local_138,(ChFrame<double> *)(this->super_ChLink).Body1,&local_f8);
    if (&local_138 != &this->m_p1) {
      (this->m_p1).m_data[0] = local_138.m_data[0];
      (this->m_p1).m_data[1] = local_138.m_data[1];
      (this->m_p1).m_data[2] = local_138.m_data[2];
    }
    ChFrame<double>::TransformPointParentToLocal
              (&local_138,(ChFrame<double> *)(this->super_ChLink).Body2,&local_118);
    if (&local_138 != &this->m_p2) {
      (this->m_p2).m_data[0] = local_138.m_data[0];
      (this->m_p2).m_data[1] = local_138.m_data[1];
      (this->m_p2).m_data[2] = local_138.m_data[2];
    }
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_138,(ChFrame<double> *)(this->super_ChLink).Body1,&local_168);
    if (&local_138 != &this->m_z1) {
      (this->m_z1).m_data[0] = local_138.m_data[0];
      (this->m_z1).m_data[1] = local_138.m_data[1];
      (this->m_z1).m_data[2] = local_138.m_data[2];
    }
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_138,(ChFrame<double> *)(this->super_ChLink).Body2,&local_68);
    if (&local_138 != &this->m_x2) {
      (this->m_x2).m_data[0] = local_138.m_data[0];
      (this->m_x2).m_data[1] = local_138.m_data[1];
      (this->m_x2).m_data[2] = local_138.m_data[2];
    }
    ChFrame<double>::TransformDirectionParentToLocal
              (&local_138,(ChFrame<double> *)(this->super_ChLink).Body2,&local_88);
    local_c0 = local_168.m_data[1];
    local_90 = local_f8.m_data[1];
    local_a8 = local_118.m_data[1];
    local_148 = (ChVector<double> *)local_f8.m_data[0];
    local_a0 = local_118.m_data[0];
    local_d8 = local_68.m_data[1];
    local_98 = local_f8.m_data[2];
    local_b0 = local_118.m_data[2];
    local_b8 = local_168.m_data[0];
    local_c8 = local_168.m_data[2];
    local_d0 = local_68.m_data[0];
    local_e0 = local_68.m_data[2];
    if (&local_138 != &this->m_y2) {
      (this->m_y2).m_data[0] = local_138.m_data[0];
      (this->m_y2).m_data[1] = local_138.m_data[1];
      (this->m_y2).m_data[2] = local_138.m_data[2];
    }
  }
  else {
    local_148 = &this->m_p1;
    if (local_148 != p1) {
      (this->m_p1).m_data[0] = p1->m_data[0];
      (this->m_p1).m_data[1] = p1->m_data[1];
      (this->m_p1).m_data[2] = p1->m_data[2];
    }
    if (&this->m_p2 != p2) {
      (this->m_p2).m_data[0] = p2->m_data[0];
      (this->m_p2).m_data[1] = p2->m_data[1];
      (this->m_p2).m_data[2] = p2->m_data[2];
    }
    Vnorm<double>(&local_168,dirZ1);
    if (&local_168 != &this->m_z1) {
      (this->m_z1).m_data[0] = local_168.m_data[0];
      (this->m_z1).m_data[1] = local_168.m_data[1];
      (this->m_z1).m_data[2] = local_168.m_data[2];
    }
    Vnorm<double>(&local_168,dirX2);
    if (&local_168 != &this->m_x2) {
      (this->m_x2).m_data[0] = local_168.m_data[0];
      (this->m_x2).m_data[1] = local_168.m_data[1];
      (this->m_x2).m_data[2] = local_168.m_data[2];
    }
    Vnorm<double>(&local_168,dirY2);
    if (&local_168 != &this->m_y2) {
      (this->m_y2).m_data[0] = local_168.m_data[0];
      (this->m_y2).m_data[1] = local_168.m_data[1];
      (this->m_y2).m_data[2] = local_168.m_data[2];
    }
    ChFrame<double>::TransformPointLocalToParent
              (&local_168,(ChFrame<double> *)(this->super_ChLink).Body1,local_148);
    local_148 = (ChVector<double> *)local_168.m_data[0];
    local_90 = local_168.m_data[1];
    local_98 = local_168.m_data[2];
    ChFrame<double>::TransformPointLocalToParent
              (&local_168,(ChFrame<double> *)(this->super_ChLink).Body2,&this->m_p2);
    local_a0 = local_168.m_data[0];
    local_a8 = local_168.m_data[1];
    local_b0 = local_168.m_data[2];
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,&this->m_z1);
    local_b8 = local_168.m_data[0];
    local_c0 = local_168.m_data[1];
    local_c8 = local_168.m_data[2];
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,&this->m_x2);
    local_d0 = local_168.m_data[0];
    local_d8 = local_168.m_data[1];
    local_e0 = local_168.m_data[2];
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,&this->m_y2);
    local_88.m_data[1] = local_168.m_data[1];
    local_88.m_data[0] = local_168.m_data[0];
    local_88.m_data[2] = local_168.m_data[2];
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_e0;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_d0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_c8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_b8;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_88.m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_88.m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_c0 * local_88.m_data[1];
  auVar6 = vfmadd231sd_fma(auVar10,auVar14,auVar6);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_c0 * local_d8;
  auVar8 = vfmadd231sd_fma(auVar13,auVar14,auVar16);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_c0 * (local_a8 - local_90);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_a0 - (double)local_148;
  auVar7 = vfmadd231sd_fma(auVar7,auVar12,auVar14);
  auVar8 = vfmadd231sd_fma(auVar8,auVar15,auVar17);
  auVar6 = vfmadd231sd_fma(auVar6,auVar15,auVar9);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_b0 - local_98;
  auVar7 = vfmadd231sd_fma(auVar7,auVar11,auVar15);
  this->m_cur_par1 = auVar8._0_8_;
  this->m_cur_par2 = auVar6._0_8_;
  this->m_cur_dot = auVar7._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_d8 * (local_a8 - local_90);
  auVar6 = vfmadd231sd_fma(auVar8,auVar12,auVar16);
  auVar6 = vfmadd231sd_fma(auVar6,auVar11,auVar17);
  this->m_cur_dist = auVar6._0_8_;
  this->m_dist = (double)((ulong)((byte)local_13c & 1) * (long)auVar6._0_8_ +
                         (ulong)!(bool)((byte)local_13c & 1) * (long)local_48);
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             bool local,
                                             const ChVector<>& p1,
                                             const ChVector<>& dirZ1,
                                             const ChVector<>& p2,
                                             const ChVector<>& dirX2,
                                             const ChVector<>& dirY2,
                                             bool auto_distance,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> p1_abs;
    ChVector<> p2_abs;
    ChVector<> z1_abs;
    ChVector<> x2_abs;
    ChVector<> y2_abs;

    if (local) {
        m_p1 = p1;
        m_p2 = p2;
        m_z1 = Vnorm(dirZ1);
        m_x2 = Vnorm(dirX2);
        m_y2 = Vnorm(dirY2);
        p1_abs = Body1->TransformPointLocalToParent(m_p1);
        p2_abs = Body2->TransformPointLocalToParent(m_p2);
        z1_abs = Body1->TransformDirectionLocalToParent(m_z1);
        x2_abs = Body2->TransformDirectionLocalToParent(m_x2);
        y2_abs = Body2->TransformDirectionLocalToParent(m_y2);
    } else {
        p1_abs = p1;
        p2_abs = p2;
        z1_abs = Vnorm(dirZ1);
        x2_abs = Vnorm(dirX2);
        y2_abs = Vnorm(dirY2);
        m_p1 = Body1->TransformPointParentToLocal(p1_abs);
        m_p2 = Body2->TransformPointParentToLocal(p2_abs);
        m_z1 = Body1->TransformDirectionParentToLocal(z1_abs);
        m_x2 = Body2->TransformDirectionParentToLocal(x2_abs);
        m_y2 = Body2->TransformDirectionParentToLocal(y2_abs);
    }

    ChVector<> d12_abs = p2_abs - p1_abs;

    m_cur_par1 = Vdot(z1_abs, x2_abs);
    m_cur_par2 = Vdot(z1_abs, y2_abs);
    m_cur_dot = Vdot(d12_abs, z1_abs);
    m_cur_dist = Vdot(d12_abs, x2_abs);

    m_dist = auto_distance ? m_cur_dist : distance;
}